

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::IntermediateNode::output
          (IntermediateNode *this,ostream *out,bool multiline,int indent)

{
  long *plVar1;
  long *plVar2;
  char cVar3;
  char cVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  uint uVar7;
  Repeat<char[5]> local_48;
  long *local_38;
  
  (*(this->super_Node)._vptr_Node[8])(&local_38,this);
  plVar2 = local_38;
  if (local_38 != (long *)0x0) {
    plVar1 = local_38 + 1;
    *(int *)plVar1 = (int)*plVar1 + 1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*local_38 + 8))(local_38);
    }
  }
  if (local_38 != (long *)0x0) {
    plVar1 = local_38 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*local_38 + 8))();
    }
  }
  if (((this->super_Node)._term._content & 3) != 2) {
    poVar5 = Kernel::operator<<(out,&(this->super_Node)._term);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ; ",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"S",1);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," -> ",4);
  puVar6 = (undefined8 *)(**(code **)(*plVar2 + 0x18))(plVar2);
  cVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
  if (cVar3 == '\0') {
    (**(code **)(*(long *)*puVar6 + 0x38))((long *)*puVar6,out,multiline,indent);
  }
  else if (multiline) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
    cVar3 = (char)out;
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    uVar7 = indent + 1;
    local_48.to_repeat = (char (*) [5])0x91988f;
    local_48.times = uVar7;
    ::Lib::Output::operator<<(out,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(out,"| ",2);
    (**(code **)(*(long *)*puVar6 + 0x38))((long *)*puVar6,out,multiline,uVar7);
    while( true ) {
      cVar4 = (**(code **)(*plVar2 + 0x10))(plVar2);
      if (cVar4 == '\0') break;
      puVar6 = (undefined8 *)(**(code **)(*plVar2 + 0x18))(plVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      local_48.to_repeat = (char (*) [5])0x91988f;
      local_48.times = uVar7;
      ::Lib::Output::operator<<(out,&local_48);
      std::__ostream_insert<char,std::char_traits<char>>(out,"| ",2);
      (**(code **)(*(long *)*puVar6 + 0x38))((long *)*puVar6,out,multiline,uVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    local_48.to_repeat = (char (*) [5])0x91988f;
    local_48.times = uVar7;
    ::Lib::Output::operator<<(out,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"[ ",2);
    (**(code **)(*(long *)*puVar6 + 0x38))((long *)*puVar6,out,0,0);
    while( true ) {
      cVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
      if (cVar3 == '\0') break;
      std::__ostream_insert<char,std::char_traits<char>>(out," | ",3);
      puVar6 = (undefined8 *)(**(code **)(*plVar2 + 0x18))(plVar2);
      (**(code **)(*(long *)*puVar6 + 0x38))((long *)*puVar6,out,0,0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out," ]",2);
  }
  plVar1 = plVar2 + 1;
  *(int *)plVar1 = (int)*plVar1 + -1;
  if ((int)*plVar1 == 0) {
    (**(code **)(*plVar2 + 8))(plVar2);
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::IntermediateNode::output(std::ostream& out, bool multiline, int indent) const 
{
  // TODO const version of allChildren
  auto childIter = iterTraits(((IntermediateNode*)this)->allChildren());
  if (!this->term().isEmpty()) {
    out << this->term()
        << " ; ";
  }
  out << "S" << this->childVar << " -> ";

  auto first = childIter.next();
  auto brackets = childIter.hasNext();
  if (brackets) {


    if (multiline) {
      auto outp = [&](Node** x) { 
        out << std::endl; 
        Output::Multiline<int>::outputIndent(out, indent + 1);
        out << "| ";
        (*x)->output(out, multiline, indent + 1);
      };
      out << "[";
      outp(first);
      while (childIter.hasNext()) {
        outp(childIter.next());
      }
      out << std::endl; 
      Output::Multiline<int>::outputIndent(out, indent + 1);
      out << "]";

    } else {
      out << "[ ";
      out << **first;
      while (childIter.hasNext()) {
        out <<  " | " << **childIter.next();
      } 
      out << " ]";
    }


  } else {
    (*first)->output(out, multiline, indent);
  }

}